

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_impl.hpp
# Opt level: O2

sequence * toml::detail::syntax::oct_int(sequence *__return_storage_ptr__,spec *param_1)

{
  repeat_at_least rStack_c8;
  character_in_range local_b0;
  literal local_a0;
  either local_88;
  sequence local_68;
  character_in_range local_48;
  character local_38;
  character_in_range local_28;
  
  local_a0.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_004daa58;
  local_a0.value_ = "0o";
  local_a0.size_ = 2;
  local_b0.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_004daa00;
  local_b0.from_ = '0';
  local_b0.to_ = '7';
  local_28.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_004daa00;
  local_28.from_ = '0';
  local_28.to_ = '7';
  local_38.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_004da940;
  local_38.value_ = '_';
  local_48.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_004daa00;
  local_48.from_ = '0';
  local_48.to_ = '7';
  sequence::sequence<toml::detail::character,toml::detail::character_in_range>
            (&local_68,&local_38,&local_48);
  either::either<toml::detail::character_in_range,toml::detail::sequence>
            (&local_88,&local_28,&local_68);
  repeat_at_least::repeat_at_least<toml::detail::either>(&rStack_c8,0,&local_88);
  sequence::
  sequence<toml::detail::literal,toml::detail::character_in_range,toml::detail::repeat_at_least>
            (__return_storage_ptr__,&local_a0,&local_b0,&rStack_c8);
  if ((_Head_base<0UL,_toml::detail::scanner_base_*,_false>)
      rStack_c8.other_.scanner_._M_t.
      super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
      ._M_t.
      super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
      .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl !=
      (_Head_base<0UL,_toml::detail::scanner_base_*,_false>)0x0) {
    (*(*(_func_int ***)
        rStack_c8.other_.scanner_._M_t.
        super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
        ._M_t.
        super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
        .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl)[1])();
  }
  rStack_c8.other_.scanner_._M_t.
  super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
  ._M_t.
  super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
  .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl =
       (unique_ptr<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>)
       (__uniq_ptr_data<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>,_true,_true>
        )0x0;
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector(&local_88.others_);
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector(&local_68.others_);
  return __return_storage_ptr__;
}

Assistant:

TOML11_INLINE sequence oct_int(const spec&)
{
    const auto digit07 = []() {
        return character_in_range(char_type('0'), char_type('7'));
    };
    return sequence(
            literal("0o"),
            digit07(),
            repeat_at_least(0,
                either(
                    digit07(),
                    sequence(character(char_type('_')), digit07())
                )
            )
        );
}